

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTimer.h
# Opt level: O0

void __thiscall HTimer::reset(HTimer *this)

{
  HTimer *in_RDI;
  double dVar1;
  HTimer *unaff_retaddr;
  int i;
  int local_c;
  
  for (local_c = 0; local_c < 0x1a; local_c = local_c + 1) {
    *(undefined8 *)(in_RDI + (long)local_c * 8 + 0xe0) = 0;
  }
  dVar1 = getWallTime(unaff_retaddr);
  *(double *)in_RDI = dVar1;
  dVar1 = getWallTick(in_RDI);
  *(double *)(in_RDI + 8) = dVar1;
  return;
}

Assistant:

void reset() {
        for (int i = 0; i < HTICK_ITEMS_COUNT; i++)
            itemTicks[i] = 0;
        startTime = getWallTime();
        startTick = getWallTick();
    }